

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_utilities.hpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
Disa::level_traversal<Disa::Adjacency_Graph<false>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,Disa *this,
          Adjacency_Graph<false> *graph,size_t i_start,size_t end_level)

{
  allocator<unsigned_long> *this_00;
  initializer_list<unsigned_long> __l;
  bool bVar1;
  source_location *location;
  ostream *poVar2;
  size_t sVar3;
  reference pvVar4;
  allocator<unsigned_long> local_1b9;
  size_t local_1b8;
  iterator local_1b0;
  size_type local_1a8;
  deque<unsigned_long,_std::allocator<unsigned_long>_> local_1a0;
  undefined1 local_150 [8];
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> vertex_queue;
  unsigned_long local_f8;
  byte local_e9;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined **local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  size_t local_28;
  size_t end_level_local;
  size_t i_start_local;
  Adjacency_Graph<false> *graph_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_level;
  
  local_28 = i_start;
  end_level_local = (size_t)graph;
  i_start_local = (size_t)this;
  graph_local = (Adjacency_Graph<false> *)__return_storage_ptr__;
  bVar1 = Adjacency_Graph<false>::empty((Adjacency_Graph<false> *)this);
  sVar3 = end_level_local;
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    local_50 = &PTR_s__workspace_llm4binary_github_lic_001c1248;
    console_format_abi_cxx11_(&local_48,(Disa *)0x0,(Log_Level)&local_50,(source_location *)i_start)
    ;
    poVar2 = std::operator<<(poVar2,(string *)&local_48);
    poVar2 = std::operator<<(poVar2,"Graph is empty.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_48);
    exit(1);
  }
  location = (source_location *)
             Adjacency_Graph<false>::size_vertex((Adjacency_Graph<false> *)i_start_local);
  if (location <= sVar3) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    local_88 = &PTR_s__workspace_llm4binary_github_lic_001c1260;
    console_format_abi_cxx11_(&local_80,(Disa *)0x0,(Log_Level)&local_88,location);
    poVar2 = std::operator<<(poVar2,(string *)&local_80);
    sVar3 = Adjacency_Graph<false>::size_vertex((Adjacency_Graph<false> *)i_start_local);
    std::__cxx11::to_string(&local_e8,sVar3);
    std::operator+(&local_c8,"Starting vertex not in range (0, ",&local_e8);
    std::operator+(&local_a8,&local_c8,"].");
    poVar2 = std::operator<<(poVar2,(string *)&local_a8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_80);
    exit(1);
  }
  local_e9 = 0;
  sVar3 = Adjacency_Graph<false>::size_vertex((Adjacency_Graph<false> *)i_start_local);
  local_f8 = std::numeric_limits<unsigned_long>::max();
  this_00 = (allocator<unsigned_long> *)
            ((long)&vertex_queue.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node + 7);
  std::allocator<unsigned_long>::allocator(this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,sVar3,&local_f8,this_00);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&vertex_queue.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node + 7));
  local_1b8 = end_level_local;
  local_1b0 = &local_1b8;
  local_1a8 = 1;
  std::allocator<unsigned_long>::allocator(&local_1b9);
  __l._M_len = local_1a8;
  __l._M_array = local_1b0;
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque(&local_1a0,__l,&local_1b9);
  std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::queue
            ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             local_150,&local_1a0);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::~deque(&local_1a0);
  std::allocator<unsigned_long>::~allocator(&local_1b9);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (__return_storage_ptr__,end_level_local);
  *pvVar4 = 0;
  level_traversal<Disa::Adjacency_Graph<false>>
            ((Adjacency_Graph<false> *)i_start_local,
             (queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             local_150,__return_storage_ptr__,local_28);
  local_e9 = 1;
  std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::~queue
            ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             local_150);
  if ((local_e9 & 1) == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::size_t> level_traversal(const _graph& graph, const std::size_t i_start,
                                         const std::size_t end_level = std::numeric_limits<std::size_t>::max()) {

  ASSERT_DEBUG(!graph.empty(), "Graph is empty.");
  ASSERT_DEBUG(i_start < graph.size_vertex(),
               "Starting vertex not in range (0, " + std::to_string(graph.size_vertex()) + "].");

  std::vector<std::size_t> vertex_level(graph.size_vertex(), std::numeric_limits<std::size_t>::max());
  std::queue<std::size_t> vertex_queue({i_start});
  vertex_level[i_start] = 0;
  level_traversal(graph, vertex_queue, vertex_level, end_level);
  return vertex_level;
}